

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O2

EStatusCode __thiscall
PDFHummus::DocumentContext::WriteFormForImage
          (DocumentContext *this,string *inImagePath,unsigned_long inImageIndex,
          ObjectIDType inObjectID,PDFParsingOptions *inParsingOptions)

{
  uchar *this_00;
  EHummusImageType EVar1;
  EStatusCode EVar2;
  IByteReaderWithPosition *inPNGStream;
  PDFFormXObject *pPVar3;
  allocator_type local_b9;
  ObjectIDType inObjectID_local;
  TIFFUsageParameters params;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  EStatusCodeAndObjectIDTypeList local_50;
  
  inObjectID_local = inObjectID;
  EVar1 = GetImageType(this,inImagePath,inImageIndex);
  switch(EVar1) {
  case ePDF:
    this_00 = params.BWTreatment.OneColor.RGBComponents + 2;
    params.GrayscaleTreatment.ZeroColor.RGBComponents[1] = '\0';
    params.GrayscaleTreatment.ZeroColor.RGBComponents[2] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[0] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[1] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[2] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[3] = '\0';
    params._30_2_ = 0;
    params.PageIndex = 1;
    params._8_8_ = this_00;
    params.GrayscaleTreatment._3_8_ = this_00;
    local_50._0_8_ = inImageIndex;
    local_50.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)inImageIndex;
    std::__cxx11::
    list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)this_00,(value_type *)&local_50);
    local_68._M_impl._M_node._M_size = 0;
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,1,&inObjectID_local,
               &local_b9);
    PDFDocumentHandler::CreateFormXObjectsFromPDF
              (&local_50,&this->mPDFDocumentHandler,inImagePath,inParsingOptions,
               (PDFPageRange *)&params,ePDFPageBoxMediaBox,(double *)0x0,
               (ObjectIDTypeList *)&local_68,(ObjectIDTypeList *)&local_80);
    EVar2 = local_50.first;
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
              (&local_50.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_80);
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_68);
    std::__cxx11::
    _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_clear((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)this_00);
    break;
  case eJPG:
    pPVar3 = JPEGImageHandler::CreateFormXObjectFromJPGFile
                       (&this->mJPEGImageHandler,inImagePath,inObjectID);
    if (pPVar3 != (PDFFormXObject *)0x0) {
      PDFFormXObject::~PDFFormXObject(pPVar3);
    }
    EVar2 = -(uint)(pPVar3 == (PDFFormXObject *)0x0);
    operator_delete(pPVar3,0x1f0);
    break;
  case eTIFF:
    TIFFUsageParameters::TIFFUsageParameters(&params);
    params.PageIndex = (uint)inImageIndex;
    pPVar3 = TIFFImageHandler::CreateFormXObjectFromTIFFFile
                       (&this->mTIFFImageHandler,inImagePath,inObjectID,&params);
    if (pPVar3 != (PDFFormXObject *)0x0) {
      PDFFormXObject::~PDFFormXObject(pPVar3);
    }
    EVar2 = -(uint)(pPVar3 == (PDFFormXObject *)0x0);
    operator_delete(pPVar3,0x1f0);
    TIFFUsageParameters::~TIFFUsageParameters(&params);
    break;
  case ePNG:
    InputFile::InputFile((InputFile *)&params);
    EVar2 = InputFile::OpenFile((InputFile *)&params,inImagePath);
    if (EVar2 == eSuccess) {
      inPNGStream = InputFile::GetInputStream((InputFile *)&params);
      pPVar3 = PNGImageHandler::CreateFormXObjectFromPNGStream
                         (&this->mPNGImageHandler,inPNGStream,inObjectID);
      if (pPVar3 != (PDFFormXObject *)0x0) {
        PDFFormXObject::~PDFFormXObject(pPVar3);
      }
      EVar2 = -(uint)(pPVar3 == (PDFFormXObject *)0x0);
      operator_delete(pPVar3,0x1f0);
    }
    else {
      EVar2 = eFailure;
    }
    InputFile::~InputFile((InputFile *)&params);
    break;
  default:
    EVar2 = eFailure;
  }
  return EVar2;
}

Assistant:

EStatusCode DocumentContext::WriteFormForImage(
	const std::string& inImagePath,
	unsigned long inImageIndex,
	ObjectIDType inObjectID,
	const PDFParsingOptions& inParsingOptions)
{
    EStatusCode status = eFailure;
    EHummusImageType imageType = GetImageType(inImagePath,inImageIndex);

    switch(imageType)
    {
        case ePDF:
        {
			PDFPageRange singlePageRange;
			singlePageRange.mType = PDFPageRange::eRangeTypeSpecific;
			singlePageRange.mSpecificRanges.push_back(ULongAndULong(inImageIndex, inImageIndex));

			status = CreateFormXObjectsFromPDF(inImagePath, inParsingOptions, singlePageRange, ePDFPageBoxMediaBox, NULL, ObjectIDTypeList(), ObjectIDTypeList(1, inObjectID)).first;
            break;
        }
        case eJPG:
        {
            PDFFormXObject* form = CreateFormXObjectFromJPGFile(inImagePath,inObjectID);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#ifndef PDFHUMMUS_NO_TIFF
		case eTIFF:
        {
            TIFFUsageParameters params;
            params.PageIndex = (unsigned int)inImageIndex;

            PDFFormXObject* form = CreateFormXObjectFromTIFFFile(inImagePath,inObjectID,params);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#endif
#ifndef PDFHUMMUS_NO_PNG
		case ePNG:
		{
			InputFile inputFile;
			if (inputFile.OpenFile(inImagePath) != eSuccess) {
				break;
			}
			PDFFormXObject* form = CreateFormXObjectFromPNGStream(inputFile.GetInputStream(), inObjectID);
			status = (form ? eSuccess : eFailure);
			delete form;
			break;
		}

		default:
        {
            status = eFailure;
        }
#endif
	}
    return status;
}